

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildFile.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_2b9946::BuildFileImpl::nodeIsScalarString
          (BuildFileImpl *this,Node *node,StringRef name)

{
  int iVar1;
  ScalarNode *scalar;
  bool bVar2;
  string local_48;
  
  scalar = (ScalarNode *)name.Data;
  if (*(int *)&this->delegate == 1) {
    (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_(&local_48,this,scalar);
    if ((ScalarNode *)local_48._M_string_length == scalar) {
      if (scalar == (ScalarNode *)0x0) {
        bVar2 = true;
      }
      else {
        iVar1 = bcmp(local_48._M_dataplus._M_p,node,(size_t)scalar);
        bVar2 = iVar1 == 0;
      }
    }
    else {
      bVar2 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool nodeIsScalarString(llvm::yaml::Node* node, StringRef name) {
    if (node->getType() != llvm::yaml::Node::NK_Scalar)
      return false;

    return stringFromScalarNode(
        static_cast<llvm::yaml::ScalarNode*>(node)) == name;
  }